

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CudaBackend.cpp
# Opt level: O2

Value __thiscall xmrig::CudaBackend::toJSON(CudaBackend *this,Document *doc)

{
  MemoryPoolAllocator<rapidjson::CrtAllocator> *allocator;
  Ch *pCVar1;
  long lVar2;
  bool value;
  char *str;
  size_t sVar3;
  Document *pDVar4;
  size_t threadId;
  uint32_t version;
  Document *in_RDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar5;
  long lVar6;
  undefined1 auVar7 [16];
  Value VVar8;
  Value versions;
  Value threads;
  Data local_158;
  undefined1 local_148 [16];
  Hashrate local_138;
  CudaBackend *local_110;
  Document *local_108;
  StringRefType local_100;
  StringRefType local_f0;
  StringRefType local_e0;
  StringRefType local_d0;
  StringRefType local_c0;
  StringRefType local_b0;
  StringRefType local_a0;
  StringRefType local_90;
  StringRefType local_80;
  StringRefType local_70;
  StringRefType local_60;
  StringRefType local_50;
  StringRefType local_40;
  
  allocator = in_RDX->allocator_;
  (this->super_IBackend)._vptr_IBackend = (_func_int **)0x0;
  this->d_ptr = (CudaBackendPrivate *)0x0;
  *(undefined2 *)((long)&this->d_ptr + 6) = 3;
  local_b0.s = "type";
  local_b0.length = 4;
  (**(code **)((doc->
               super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               ).data_.n.i64 + 0x28))(doc);
  String::toJSON((String *)(local_148 + 0x10));
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)this,&local_b0,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)(local_148 + 0x10),allocator);
  local_40.s = "enabled";
  local_40.length = 7;
  value = (bool)(**(code **)((doc->
                             super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                             ).data_.n.i64 + 0x10))(doc);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<bool>((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)this,&local_40,value,allocator);
  uVar5 = extraout_RDX;
  if (CudaLib::m_ready == '\x01') {
    local_158.n.i64 = (Number)0x0;
    local_158.s.str = (Ch *)0x3000000000000;
    local_c0.s = "cuda-runtime";
    local_c0.length = 0xc;
    CudaLib::version_abi_cxx11_
              ((string *)(local_148 + 0x10),
               (CudaLib *)
               (ulong)*(uint *)((doc->
                                super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                ).data_.s.str + 0x5c),(uint32_t)extraout_RDX);
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  *)local_148,(Ch *)local_138.m_threads,allocator);
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)&local_158.s,&local_c0,
              (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)local_148,allocator);
    std::__cxx11::string::~string((string *)(local_148 + 0x10));
    local_d0.s = "cuda-driver";
    local_d0.length = 0xb;
    CudaLib::version_abi_cxx11_
              ((string *)(local_148 + 0x10),
               (CudaLib *)
               (ulong)*(uint *)((doc->
                                super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                ).data_.s.str + 0x58),version);
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  *)local_148,(Ch *)local_138.m_threads,allocator);
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)&local_158.s,&local_d0,
              (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)local_148,allocator);
    std::__cxx11::string::~string((string *)(local_148 + 0x10));
    local_e0.s = "plugin";
    local_e0.length = 6;
    str = CudaLib::pluginVersion();
    String::String((String *)local_148,str);
    String::toJSON((String *)(local_148 + 0x10),(Document *)local_148);
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)&local_158.s,&local_e0,
              (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)(local_148 + 0x10),allocator);
    String::~String((String *)local_148);
    if (NvmlLib::m_ready == '\x01') {
      local_50.s = "nvml";
      local_50.length = 4;
      local_60.s = NvmlLib::m_nvmlVersion;
      sVar3 = strlen(NvmlLib::m_nvmlVersion);
      local_60.length = (SizeType)sVar3;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&local_158.s,&local_50,&local_60,allocator);
      local_70.s = "driver";
      local_70.length = 6;
      local_80.s = NvmlLib::m_driverVersion;
      sVar3 = strlen(NvmlLib::m_driverVersion);
      local_80.length = (SizeType)sVar3;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&local_158.s,&local_70,&local_80,allocator);
    }
    local_90.s = "versions";
    local_90.length = 8;
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)this,&local_90,
              (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)&local_158.s,allocator);
    uVar5 = extraout_RDX_00;
  }
  pCVar1 = (doc->
           super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
           ).data_.s.str;
  if (*(long *)(pCVar1 + 0x40) != *(long *)(pCVar1 + 0x48)) {
    auVar7 = (**(code **)((doc->
                          super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                          ).data_.n.i64 + 0x20))(doc);
    uVar5 = auVar7._8_8_;
    if (auVar7._0_8_ != 0) {
      local_f0.s = "hashrate";
      local_f0.length = 8;
      pDVar4 = (Document *)
               (**(code **)((doc->
                            super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                            ).data_.n.i64 + 0x20))(doc);
      Hashrate::toJSON((Hashrate *)(local_148 + 0x10),pDVar4);
      local_110 = this;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)this,&local_f0,
                  (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)(local_148 + 0x10),allocator);
      local_138.m_threads = 0;
      local_138.m_top = (uint32_t *)0x4000000000000;
      pCVar1 = (doc->
               super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               ).data_.s.str;
      lVar2 = *(long *)(pCVar1 + 0x48);
      pDVar4 = (Document *)0x0;
      local_108 = doc;
      for (lVar6 = *(long *)(pCVar1 + 0x40); this = local_110, lVar6 != lVar2; lVar6 = lVar6 + 0x30)
      {
        CudaThread::toJSON((CudaThread *)&local_158.s,(Document *)(lVar6 + 0x10));
        local_100.s = "hashrate";
        local_100.length = kParseErrorStringUnicodeEscapeInvalidHex;
        threadId = (**(code **)((local_108->
                                super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                ).data_.n.i64 + 0x20))();
        Hashrate::toJSON((Hashrate *)local_148,threadId,pDVar4);
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)&local_158.s,&local_100,
                    (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)local_148,allocator);
        CudaDevice::toJSON(*(CudaDevice **)(lVar6 + 8),(Value *)&local_158.s,in_RDX);
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::PushBack((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    *)(local_148 + 0x10),
                   (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    *)&local_158.s,allocator);
        pDVar4 = (Document *)
                 ((long)&(pDVar4->
                         super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                         ).data_ + 1);
      }
      local_a0.s = "threads";
      local_a0.length = 7;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)local_110,&local_a0,
                  (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)(local_148 + 0x10),allocator);
      uVar5 = extraout_RDX_01;
    }
  }
  VVar8.data_.s.str = (Ch *)uVar5;
  VVar8.data_.n = (Number)this;
  return (Value)VVar8.data_;
}

Assistant:

rapidjson::Value xmrig::CudaBackend::toJSON(rapidjson::Document &doc) const
{
    using namespace rapidjson;
    auto &allocator = doc.GetAllocator();

    Value out(kObjectType);
    out.AddMember("type",       type().toJSON(), allocator);
    out.AddMember("enabled",    isEnabled(), allocator);

    if (CudaLib::isReady()) {
        Value versions(kObjectType);
        versions.AddMember("cuda-runtime",   Value(CudaLib::version(d_ptr->runtimeVersion).c_str(), allocator), allocator);
        versions.AddMember("cuda-driver",    Value(CudaLib::version(d_ptr->driverVersion).c_str(), allocator), allocator);
        versions.AddMember("plugin",         String(CudaLib::pluginVersion()).toJSON(doc), allocator);

#       ifdef XMRIG_FEATURE_NVML
        if (NvmlLib::isReady()) {
            versions.AddMember("nvml",       StringRef(NvmlLib::version()), allocator);
            versions.AddMember("driver",     StringRef(NvmlLib::driverVersion()), allocator);
        }
#       endif

        out.AddMember("versions", versions, allocator);
    }

    if (d_ptr->threads.empty() || !hashrate()) {
        return out;
    }

    out.AddMember("hashrate", hashrate()->toJSON(doc), allocator);

    Value threads(kArrayType);

    size_t i = 0;
    for (const auto &data : d_ptr->threads) {
        Value thread = data.thread.toJSON(doc);
        thread.AddMember("hashrate", hashrate()->toJSON(i, doc), allocator);

        data.device.toJSON(thread, doc);

        i++;
        threads.PushBack(thread, allocator);
    }

    out.AddMember("threads", threads, allocator);

    return out;
}